

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TagVisitor<ModuleDefinitionFileTag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TagVisitor(TagVisitor<ModuleDefinitionFileTag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,cmTarget *target,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  TargetType TVar1;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  cmTarget *target_local;
  TagVisitor<ModuleDefinitionFileTag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->Data = data;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->BadObjLibFiles);
  this->Target = target;
  this_00 = cmTarget::GetMakefile(target);
  pcVar2 = cmMakefile::GetGlobalGenerator(this_00);
  this->GlobalGenerator = pcVar2;
  cmsys::RegularExpression::RegularExpression
            (&this->Header,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  TVar1 = cmTarget::GetType(target);
  this->IsObjLib = TVar1 == OBJECT_LIBRARY;
  return;
}

Assistant:

TagVisitor(cmTarget *target, DataType& data)
    : Data(data), Target(target),
    GlobalGenerator(target->GetMakefile()->GetGlobalGenerator()),
    Header(CM_HEADER_REGEX),
    IsObjLib(target->GetType() == cmTarget::OBJECT_LIBRARY)
  {
  }